

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

ssize_t __thiscall vox::DICT::write(DICT *this,int __fd,void *__buf,size_t __n)

{
  FILE *__s;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  undefined4 in_register_00000034;
  int i;
  long lVar1;
  long lVar2;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  this->count = (int32_t)(((long)(this->keys).
                                 super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->keys).
                                super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x50);
  fwrite(this,4,1,__s);
  lVar2 = 0;
  __buf_00 = extraout_RDX;
  for (lVar1 = 0; lVar1 < this->count; lVar1 = lVar1 + 1) {
    DICTitem::write((DICTitem *)
                    ((long)&(((this->keys).
                              super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>.
                              _M_impl.super__Vector_impl_data._M_start)->key).bufferSize + lVar2),
                    __fd,__buf_00,(size_t)__s);
    lVar2 = lVar2 + 0x50;
    __buf_00 = extraout_RDX_00;
  }
  return (long)this->count;
}

Assistant:

void DICT::write(FILE* fp) {
    count = (int32_t)keys.size();
    fwrite(&count, sizeof(int32_t), 1, fp);
    for (int i = 0; i < count; i++)
        keys[i].write(fp);
}